

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
               (string *s,char *fmt,bool *v,bool *args,int *args_1,int *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7)

{
  long lVar1;
  ulong uVar2;
  char *in_RCX;
  string *in_RDX;
  char *pcVar3;
  string *in_RDI;
  bool *in_R8;
  int *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  bool *in_stack_00000010;
  string *in_stack_00000018;
  char *in_stack_00000020;
  string *in_stack_00000028;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd50;
  char **in_stack_fffffffffffffd58;
  char **in_stack_fffffffffffffd60;
  string *v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  string local_270 [32];
  undefined8 local_250;
  string local_248 [16];
  char *in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd4;
  char *in_stack_fffffffffffffdd8;
  LogLevel in_stack_fffffffffffffde4;
  undefined1 local_218 [376];
  string local_a0 [32];
  undefined4 local_80;
  undefined1 local_6b;
  byte local_6a;
  byte local_69;
  string local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  
  copyToFormatString(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  lVar1 = std::__cxx11::string::find((char)local_68,0x2a);
  local_69 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_68,0x73);
  local_6a = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_68,100);
  local_6b = lVar1 != -1;
  if ((local_69 & 1) == 0) {
    if ((local_6a & 1) == 0) {
      if ((bool)local_6b) {
        v_00 = local_68;
        pcVar3 = (char *)std::__cxx11::string::find((char)v_00,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)v_00,(ulong)pcVar3,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(pcVar3,(bool *)v_00);
        std::__cxx11::string::operator+=(in_RDI,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
      else if ((local_6a & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                   in_stack_fffffffffffffdc8);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd68,(bool *)in_stack_fffffffffffffd60);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd70);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffdd8);
        std::ostream::operator<<(local_218,(bool)((byte)in_RDX->_M_dataplus & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_250 = std::__cxx11::string::c_str();
        formatOne<char_const*>((char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        std::__cxx11::string::operator+=(in_RDI,local_248);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_270);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffdd8);
      }
    }
    else {
      pcVar3 = "false";
      if (((byte)in_RDX->_M_dataplus & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               unaff_R14,unaff_R15,unaff_retaddr,in_stack_00000008);
    local_80 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
               (bool *)in_stack_00000008,in_R9,(int *)in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
    local_80 = 1;
  }
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}